

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

time_ms_t __thiscall Container::get_time_usage_ms(Container *this)

{
  CgroupController *pCVar1;
  longlong lVar2;
  size_t in_RCX;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  string data;
  Container *this_local;
  
  pCVar1 = this->cpuacct_controller_;
  data.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"cpuacct.usage",&local_51);
  CgroupController::read((CgroupController *)local_30,(int)pCVar1,local_50,in_RCX);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  lVar2 = std::__cxx11::stoll((string *)local_30,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)local_30);
  return lVar2 / 1000000;
}

Assistant:

time_ms_t Container::get_time_usage_ms() {
    std::string data = cpuacct_controller_->read("cpuacct.usage");
    return stoll(data) / 1000000;
}